

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O2

bool __thiscall Liby::http::ReplyParser::ParseStatus(ReplyParser *this,char *begin,char *end)

{
  int iVar1;
  iterator iVar2;
  int status;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38);
  iVar1 = std::__cxx11::stoi(&local_38,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_38);
  status = iVar1;
  iVar2 = std::
          _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&status_number_abi_cxx11_._M_h,&status);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    this->progress_ = 3;
    (this->super_Reply).status_ = status;
  }
  return iVar2.
         super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

bool ReplyParser::ParseStatus(const char *begin, const char *end) {
    int status = std::stoi(std::string(begin, end));
    auto it = status_number.find(status);
    if (it == status_number.end()) {
        return false;
    } else {
        progress_ = ParsingStatusString;
        status_ = status;
        return true;
    }
}